

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

VectorXcd __thiscall ChebTools::eigenvalues(ChebTools *this,MatrixXd *A,bool balance)

{
  undefined7 in_register_00000011;
  Index extraout_RDX;
  Index IVar1;
  EigenvaluesReturnType EVar2;
  VectorXcd VVar3;
  MatrixXd Abalanced;
  MatrixXd D;
  MatrixXd local_48;
  MatrixXd local_28;
  
  if ((int)CONCAT71(in_register_00000011,balance) == 0) {
    EVar2 = Eigen::internal::eigenvalues_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::
            run((eigenvalues_selector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_false> *)this,
                (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
    IVar1 = EVar2.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
  }
  else {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    balance_matrix(A,&local_48,&local_28);
    Eigen::internal::eigenvalues_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::run
              ((eigenvalues_selector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_false> *)this,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_48);
    free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    IVar1 = extraout_RDX;
  }
  VVar3.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = IVar1;
  VVar3.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (complex<double> *)this;
  return (VectorXcd)
         VVar3.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
         m_storage;
}

Assistant:

Eigen::VectorXcd eigenvalues(const Eigen::MatrixXd &A, bool balance) {
        if (balance) {
            Eigen::MatrixXd Abalanced, D;
            balance_matrix(A, Abalanced, D);
            return Abalanced.eigenvalues();
        }
        else {
            return A.eigenvalues();
        }
    }